

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O1

void rb_insert_node(rb_node **rbt,rb_node *rbn,ly_bool *max_p)

{
  rb_node *prVar1;
  bool bVar2;
  int iVar3;
  rb_node **pprVar4;
  rb_node *prVar5;
  ly_bool lVar6;
  ly_bool lVar7;
  rb_node *prVar8;
  code *pcVar9;
  
  prVar1 = *rbt;
  pcVar9 = rb_compare_lists;
  if (prVar1->dnode->schema->nodetype == 8) {
    pcVar9 = rb_compare_leaflists;
  }
  bVar2 = false;
  lVar7 = '\x01';
  lVar6 = '\x01';
  if (prVar1 == (rb_node *)0x0) {
    prVar8 = (rb_node *)0x0;
  }
  else {
    do {
      prVar8 = prVar1;
      iVar3 = (*pcVar9)(prVar8->dnode,rbn->dnode);
      lVar7 = lVar6;
      if (0 < iVar3) {
        lVar7 = '\0';
      }
      prVar1 = (&prVar8->left)[iVar3 < 1];
      lVar6 = lVar7;
    } while ((&prVar8->left)[iVar3 < 1] != (rb_node *)0x0);
    bVar2 = 0 < iVar3;
  }
  rbn->parent = prVar8;
  rbn->left = (rb_node *)0x0;
  rbn->right = (rb_node *)0x0;
  rbn->color = '\x01';
  pprVar4 = rbt;
  if (prVar8 != (rb_node *)0x0) {
    if (bVar2) {
      pprVar4 = &prVar8->left;
    }
    else {
      pprVar4 = &prVar8->right;
    }
  }
  *pprVar4 = rbn;
  prVar1 = rbn->parent;
  do {
    if ((prVar1 == (rb_node *)0x0) || (prVar1->color != '\x01')) {
      (*rbt)->color = '\0';
      if (max_p != (ly_bool *)0x0) {
        *max_p = lVar7;
      }
      return;
    }
    prVar8 = prVar1->parent;
    prVar5 = prVar8->left;
    if (prVar1 == prVar5) {
      prVar5 = prVar8->right;
      if ((prVar5 != (rb_node *)0x0) && (prVar5->color == '\x01')) goto LAB_001578b0;
      prVar5 = prVar1;
      if (prVar1->right == rbn) {
        rb_rotate_left(rbt,prVar1);
        prVar5 = rbn;
        rbn = prVar1;
      }
      prVar5->color = '\0';
      prVar8->color = '\x01';
      rb_rotate_right(rbt,prVar8);
    }
    else if ((prVar5 == (rb_node *)0x0) || (prVar5->color != '\x01')) {
      prVar5 = prVar1;
      if (prVar1->left == rbn) {
        rb_rotate_right(rbt,prVar1);
        prVar5 = rbn;
        rbn = prVar1;
      }
      prVar5->color = '\0';
      prVar8->color = '\x01';
      rb_rotate_left(rbt,prVar8);
    }
    else {
LAB_001578b0:
      prVar5->color = '\0';
      prVar1->color = '\0';
      prVar8->color = '\x01';
      rbn = prVar8;
    }
    prVar1 = rbn->parent;
  } while( true );
}

Assistant:

static void
rb_insert_node(struct rb_node **rbt, struct rb_node *rbn, ly_bool *max_p)
{
    ly_bool max;
    struct rb_node *tmp;
    struct rb_node *parent = NULL;
    int comp = 0;

    int (*rb_compare)(const struct lyd_node *n1, const struct lyd_node *n2);

    if (RBN_DNODE(*rbt)->schema->nodetype == LYS_LEAFLIST) {
        rb_compare = rb_compare_leaflists;
    } else {
        rb_compare = rb_compare_lists;
    }

    max = 1;
    tmp = *rbt;
    while (tmp != NULL) {
        parent = tmp;

        comp = rb_compare(RBN_DNODE(tmp), RBN_DNODE(rbn));
        if (comp > 0) {
            tmp = RBN_LEFT(tmp);
            max = 0;
        } else {
            tmp = RBN_RIGHT(tmp);
        }
    }

    rb_set(rbn, parent);

    if (parent != NULL) {
        if (comp > 0) {
            RBN_LEFT(parent) = rbn;
        } else {
            RBN_RIGHT(parent) = rbn;
        }
    } else {
        *rbt = rbn;
    }

    rb_insert_color(rbt, rbn);

    if (max_p) {
        *max_p = max;
    }
}